

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

PHYSFS_sint64 zip64_find_end_of_central_dir(PHYSFS_Io *io,PHYSFS_sint64 _pos,PHYSFS_uint64 offset)

{
  _func_int_PHYSFS_Io_ptr_PHYSFS_uint64 *p_Var1;
  undefined8 uVar2;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  void *buf;
  undefined1 *puVar5;
  undefined8 *puVar6;
  undefined1 *ptr;
  uint uVar7;
  size_t len;
  undefined1 auStack_38 [4];
  PHYSFS_uint32 local_34 [2];
  PHYSFS_uint32 ui32;
  
  local_34[0] = (PHYSFS_uint32)((ulong)in_RAX >> 0x20);
  puVar5 = auStack_38;
  if (_pos < 1) {
    __assert_fail("_pos > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_zip.c"
                  ,0x4aa,
                  "PHYSFS_sint64 zip64_find_end_of_central_dir(PHYSFS_Io *, PHYSFS_sint64, PHYSFS_uint64)"
                 );
  }
  iVar3 = (*io->seek)(io,offset);
  if (iVar3 == 0) {
    return -1;
  }
  iVar3 = readui32(io,local_34);
  if (iVar3 == 0) {
    return -1;
  }
  if (local_34[0] == 0x6064b50) {
    return offset;
  }
  if (0x38 < (ulong)_pos) {
    iVar3 = (*io->seek)(io,_pos - 0x38U);
    if (iVar3 == 0) {
      return -1;
    }
    iVar3 = readui32(io,local_34);
    if (iVar3 == 0) {
      return -1;
    }
    if (local_34[0] == 0x6064b50) {
      return _pos - 0x38U;
    }
    if (0x54 < (ulong)_pos) {
      iVar3 = (*io->seek)(io,_pos - 0x54U);
      if (iVar3 == 0) {
        return -1;
      }
      iVar3 = readui32(io,local_34);
      if (iVar3 == 0) {
        return -1;
      }
      if (local_34[0] == 0x6064b50) {
        return _pos - 0x54U;
      }
    }
  }
  uVar4 = _pos - offset;
  if (4 < (ulong)_pos && (offset <= (ulong)_pos && uVar4 != 0)) {
    len = 0x40000;
    if (uVar4 < 0x40000) {
      len = uVar4;
    }
    if (uVar4 < 0x100) {
      ptr = auStack_38 + -(len + 0x17 & 0xfffffffffffffff0);
      puVar5 = ptr;
    }
    else {
      ptr = (undefined1 *)0x0;
      puVar5 = auStack_38;
    }
    *(undefined8 *)(puVar5 + -8) = 0x114461;
    buf = __PHYSFS_initSmallAlloc(ptr,len);
    if (buf == (void *)0x0) {
      puVar6 = (undefined8 *)(puVar5 + -8);
      *(undefined8 *)(puVar5 + -8) = 2;
      goto LAB_001144d4;
    }
    p_Var1 = io->seek;
    *(undefined8 *)(puVar5 + -8) = 0x114476;
    iVar3 = (*p_Var1)(io,_pos - len);
    if (iVar3 == 0) {
LAB_001144bc:
      *(undefined8 *)(puVar5 + -8) = 0x1144c4;
      __PHYSFS_smallFree(buf);
      return -1;
    }
    *(undefined8 *)(puVar5 + -8) = 0x114488;
    iVar3 = __PHYSFS_readAll(io,buf,len);
    if (iVar3 == 0) goto LAB_001144bc;
    for (uVar7 = (int)len - 4; -1 < (int)uVar7; uVar7 = uVar7 - 1) {
      uVar4 = (ulong)uVar7;
      if ((((*(char *)((long)buf + uVar4) == 'P') && (*(char *)((long)buf + uVar4 + 1) == 'K')) &&
          (*(char *)((long)buf + uVar4 + 2) == '\x06')) &&
         (*(char *)((long)buf + uVar4 + 3) == '\x06')) {
        *(undefined8 *)(puVar5 + -8) = 0x1144f7;
        __PHYSFS_smallFree(buf);
        return (_pos - len) + uVar4;
      }
    }
    *(undefined8 *)(puVar5 + -8) = 0x1144d2;
    __PHYSFS_smallFree(buf);
  }
  puVar6 = (undefined8 *)(puVar5 + -8);
  *(undefined8 *)(puVar5 + -8) = 0x12;
LAB_001144d4:
  uVar2 = *puVar6;
  *puVar6 = 0x1144da;
  PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar2);
  return -1;
}

Assistant:

static PHYSFS_sint64 zip64_find_end_of_central_dir(PHYSFS_Io *io,
                                                   PHYSFS_sint64 _pos,
                                                   PHYSFS_uint64 offset)
{
    /*
     * Naturally, the offset is useless to us; it is the offset from the
     *  start of file, which is meaningless if we've appended this .zip to
     *  a self-extracting .exe. We need to find this on our own. It should
     *  be directly before the locator record, but the record in question,
     *  like the original end-of-central-directory record, ends with a
     *  variable-length field. Unlike the original, which has to store the
     *  size of that variable-length field in a 16-bit int and thus has to be
     *  within 64k, the new one gets 64-bits.
     *
     * Fortunately, the only currently-specified record for that variable
     *  length block is some weird proprietary thing that deals with EBCDIC
     *  and tape backups or something. So we don't seek far.
     */

    PHYSFS_uint32 ui32;
    const PHYSFS_uint64 pos = (PHYSFS_uint64) _pos;

    assert(_pos > 0);

    /* Try offset specified in the Zip64 end of central directory locator. */
    /* This works if the entire PHYSFS_Io is the zip file. */
    BAIL_IF_ERRPASS(!io->seek(io, offset), -1);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), -1);
    if (ui32 == ZIP64_END_OF_CENTRAL_DIR_SIG)
        return offset;

    /* Try 56 bytes before the Zip64 end of central directory locator. */
    /* This works if the record isn't variable length and is version 1. */
    if (pos > 56)
    {
        BAIL_IF_ERRPASS(!io->seek(io, pos-56), -1);
        BAIL_IF_ERRPASS(!readui32(io, &ui32), -1);
        if (ui32 == ZIP64_END_OF_CENTRAL_DIR_SIG)
            return pos-56;
    } /* if */

    /* Try 84 bytes before the Zip64 end of central directory locator. */
    /* This works if the record isn't variable length and is version 2. */
    if (pos > 84)
    {
        BAIL_IF_ERRPASS(!io->seek(io, pos-84), -1);
        BAIL_IF_ERRPASS(!readui32(io, &ui32), -1);
        if (ui32 == ZIP64_END_OF_CENTRAL_DIR_SIG)
            return pos-84;
    } /* if */

    /* Ok, brute force: we know it's between (offset) and (pos) somewhere. */
    /*  Just try moving back at most 256k. Oh well. */
    if ((offset < pos) && (pos > 4))
    {
        const size_t maxbuflen = 256 * 1024;
        size_t len = (size_t) (pos - offset);
        PHYSFS_uint8 *buf = NULL;
        PHYSFS_sint32 i;

        if (len > maxbuflen)
            len = maxbuflen;

        buf = (PHYSFS_uint8 *) __PHYSFS_smallAlloc(len);
        BAIL_IF(!buf, PHYSFS_ERR_OUT_OF_MEMORY, -1);

        if (!io->seek(io, pos - len) || !__PHYSFS_readAll(io, buf, len))
        {
            __PHYSFS_smallFree(buf);
            return -1;  /* error was set elsewhere. */
        } /* if */

        for (i = (PHYSFS_sint32) (len - 4); i >= 0; i--)
        {
            if ( (buf[i] == 0x50) && (buf[i+1] == 0x4b) &&
                 (buf[i+2] == 0x06) && (buf[i+3] == 0x06) )
            {
                __PHYSFS_smallFree(buf);
                return pos - ((PHYSFS_sint64) (len - i));
            } /* if */
        } /* for */

        __PHYSFS_smallFree(buf);
    } /* if */

    BAIL(PHYSFS_ERR_CORRUPT, -1);  /* didn't find it. */
}